

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O3

bool RegexTree::nullable(tree_node *ptr)

{
  char cVar1;
  tree_node *ptr_00;
  bool bVar2;
  
  cVar1 = ptr->c;
  do {
    if (cVar1 == '\a') {
      return true;
    }
    ptr_00 = ptr->left;
    if ((ptr_00 == (tree_node *)0x0) && (ptr->right == (tree_node *)0x0)) {
      return false;
    }
    if (cVar1 == '\b') {
      bVar2 = nullable(ptr_00);
      if (!bVar2) {
        return false;
      }
    }
    else {
      if (cVar1 != '\n') {
        if (cVar1 != '\t') {
          return false;
        }
        return true;
      }
      bVar2 = nullable(ptr_00);
      if (bVar2) {
        return true;
      }
    }
    ptr = ptr->right;
    cVar1 = ptr->c;
  } while( true );
}

Assistant:

bool RegexTree::nullable(const tree_node *ptr) {
    if (ptr->c == EPSILON) return true;

    if (ptr->left == nullptr && ptr->right == nullptr) return false;
    if (ptr->c == OR)
        return nullable(ptr->left) || nullable(ptr->right);
    if (ptr->c == CAT)
        return nullable(ptr->left) && nullable(ptr->right);
    return ptr->c == STAR;
}